

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> * __thiscall
S2Builder::SortInputVertices
          (vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>
           *__return_storage_ptr__,S2Builder *this)

{
  size_type sVar1;
  ulong uVar2;
  reference p;
  iterator __first;
  iterator __last;
  S2CellId local_44;
  pair<S2CellId,_int> local_3c;
  int local_30 [2];
  InputVertexId i;
  undefined1 local_19;
  S2Builder *local_18;
  S2Builder *this_local;
  vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_> *keys;
  
  local_19 = 0;
  local_18 = this;
  this_local = (S2Builder *)__return_storage_ptr__;
  std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::vector
            (__return_storage_ptr__);
  sVar1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                    (&this->input_vertices_);
  std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::reserve
            (__return_storage_ptr__,sVar1);
  for (local_30[0] = 0; uVar2 = (ulong)local_30[0],
      sVar1 = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::size
                        (&this->input_vertices_), uVar2 < sVar1; local_30[0] = local_30[0] + 1) {
    p = std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::operator[]
                  (&this->input_vertices_,(long)local_30[0]);
    S2CellId::S2CellId(&local_44,p);
    std::pair<S2CellId,_int>::pair<S2CellId,_int_&,_true>(&local_3c,&local_44,local_30);
    std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::push_back
              (__return_storage_ptr__,&local_3c);
  }
  __first = std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::begin
                      (__return_storage_ptr__);
  __last = std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>::end
                     (__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<S2CellId,int>*,std::vector<std::pair<S2CellId,int>,std::allocator<std::pair<S2CellId,int>>>>,S2Builder::SortInputVertices()::__0>
            ((__normal_iterator<std::pair<S2CellId,_int>_*,_std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::pair<S2CellId,_int>_*,_std::vector<std::pair<S2CellId,_int>,_std::allocator<std::pair<S2CellId,_int>_>_>_>
              )__last._M_current,(anon_class_8_1_8991fb9c)this);
  return __return_storage_ptr__;
}

Assistant:

vector<S2Builder::InputVertexKey> S2Builder::SortInputVertices() {
  // Sort all the input vertices in the order that we wish to consider them as
  // candidate Voronoi sites.  Any sort order will produce correct output, so
  // we have complete flexibility in choosing the sort key.  We could even
  // leave them unsorted, although this would have the disadvantage that
  // changing the order of the input edges could cause S2Builder to snap to a
  // different set of Voronoi sites.
  //
  // We have chosen to sort them primarily by S2CellId since this improves the
  // performance of many S2Builder phases (due to better spatial locality).
  // It also allows the possibility of replacing the current S2PointIndex
  // approach with a more efficient recursive divide-and-conquer algorithm.
  //
  // However, sorting by leaf S2CellId alone has two small disadvantages in
  // the case where the candidate sites are densely spaced relative to the
  // snap radius (e.g., when using the IdentitySnapFunction, or when snapping
  // to E6/E7 near the poles, or snapping to S2CellId/E6/E7 using a snap
  // radius larger than the minimum value required):
  //
  //  - First, it tends to bias the Voronoi site locations towards points that
  //    are earlier on the S2CellId Hilbert curve.  For example, suppose that
  //    there are two parallel rows of input vertices on opposite sides of the
  //    edge between two large S2Cells, and the rows are separated by less
  //    than the snap radius.  Then only vertices from the cell with the
  //    smaller S2CellId are selected, because they are considered first and
  //    prevent us from selecting the sites from the other cell (because they
  //    are closer than "snap_radius" to an existing site).
  //
  //  - Second, it tends to choose more Voronoi sites than necessary, because
  //    at each step we choose the first site along the Hilbert curve that is
  //    at least "snap_radius" away from all previously selected sites.  This
  //    tends to yield sites whose "coverage discs" overlap quite a bit,
  //    whereas it would be better to cover all the input vertices with a
  //    smaller set of coverage discs that don't overlap as much.  (This is
  //    the "geometric set cover problem", which is NP-hard.)
  //
  // It is not worth going to much trouble to fix these problems, because they
  // really aren't that important (and don't affect the guarantees made by the
  // algorithm), but here are a couple of heuristics that might help:
  //
  // 1. Sort the input vertices by S2CellId at a coarse level (down to cells
  // that are O(snap_radius) in size), and then sort by a fingerprint of the
  // S2Point coordinates (i.e., quasi-randomly).  This would retain most of
  // the advantages of S2CellId sorting, but makes it more likely that we will
  // select sites that are further apart.
  //
  // 2. Rather than choosing the first uncovered input vertex and snapping it
  // to obtain the next Voronoi site, instead look ahead through following
  // candidates in S2CellId order and choose the furthest candidate whose
  // snapped location covers all previous uncovered input vertices.
  //
  // TODO(ericv): Experiment with these approaches.

  vector<InputVertexKey> keys;
  keys.reserve(input_vertices_.size());
  for (InputVertexId i = 0; i < input_vertices_.size(); ++i) {
    keys.push_back(InputVertexKey(S2CellId(input_vertices_[i]), i));
  }
  std::sort(keys.begin(), keys.end(),
            [this](const InputVertexKey& a, const InputVertexKey& b) {
      if (a.first < b.first) return true;
      if (b.first < a.first) return false;
      return input_vertices_[a.second] < input_vertices_[b.second];
    });
  return keys;
}